

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.h
# Opt level: O0

Vec3f TRM::barycentric<3ul>
                (vec<3,_float,_(glm::qualifier)0> A,vec<3,_float,_(glm::qualifier)0> B,
                vec<3,_float,_(glm::qualifier)0> C,vec<3,_float,_(glm::qualifier)0> P)

{
  float fVar1;
  float fVar2;
  Vec3f VVar3;
  float *pfVar4;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *this;
  float extraout_XMM0_Da;
  vec<3,_float,_(glm::qualifier)0> vVar5;
  vec<3,_float,_(glm::qualifier)0> local_c8;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_b8;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_b4;
  Vec3f u;
  int i;
  Vec3f s [2];
  undefined1 local_7c [8];
  vec<3,_float,_(glm::qualifier)0> P_local;
  undefined1 local_60 [8];
  vec<3,_float,_(glm::qualifier)0> C_local;
  undefined1 local_40 [8];
  vec<3,_float,_(glm::qualifier)0> B_local;
  undefined1 local_20 [8];
  vec<3,_float,_(glm::qualifier)0> A_local;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_c;
  
  P_local.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)P.field_2;
  register0x00001380 = P._0_8_;
  C_local.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)C.field_2;
  P_local._4_8_ = C._0_8_;
  B_local.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)B.field_2;
  register0x00001280 = B._0_8_;
  A_local.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)A.field_2;
  register0x00001200 = A._0_8_;
  local_7c = (undefined1  [8])register0x00001380;
  local_60 = (undefined1  [8])P_local._4_8_;
  local_40 = (undefined1  [8])register0x00001280;
  local_20 = (undefined1  [8])register0x00001200;
  for (u.field_1.y = 0.0; (int)u.field_1 < 2; u.field_1.y = u.field_1.y + 1) {
    pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                       ((vec<3,_float,_(glm::qualifier)0> *)local_60,(length_type)u.field_1);
    fVar1 = *pfVar4;
    pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                       ((vec<3,_float,_(glm::qualifier)0> *)local_20,(length_type)u.field_1);
    fVar2 = *pfVar4;
    pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                       ((vec<3,_float,_(glm::qualifier)0> *)&(&u)[(int)u.field_1].field_2,0);
    *pfVar4 = fVar1 - fVar2;
    pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                       ((vec<3,_float,_(glm::qualifier)0> *)local_40,(length_type)u.field_1);
    fVar1 = *pfVar4;
    pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                       ((vec<3,_float,_(glm::qualifier)0> *)local_20,(length_type)u.field_1);
    fVar2 = *pfVar4;
    pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                       ((vec<3,_float,_(glm::qualifier)0> *)&(&u)[(int)u.field_1].field_2,1);
    *pfVar4 = fVar1 - fVar2;
    pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                       ((vec<3,_float,_(glm::qualifier)0> *)local_20,(length_type)u.field_1);
    fVar1 = *pfVar4;
    pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                       ((vec<3,_float,_(glm::qualifier)0> *)local_7c,(length_type)u.field_1);
    fVar2 = *pfVar4;
    pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                       ((vec<3,_float,_(glm::qualifier)0> *)&(&u)[(int)u.field_1].field_2,2);
    *pfVar4 = fVar1 - fVar2;
  }
  vVar5 = glm::cross<float,(glm::qualifier)0>
                    ((vec<3,_float,_(glm::qualifier)0> *)&u.field_2,
                     (vec<3,_float,_(glm::qualifier)0> *)&s[0].field_1);
  local_c8._0_8_ = vVar5._0_8_;
  local_b8 = local_c8.field_0;
  aStack_b4 = local_c8.field_1;
  local_c8.field_2 = vVar5.field_2;
  u.field_0.x = local_c8.field_2.z;
  this = &local_b8;
  glm::vec<3,_float,_(glm::qualifier)0>::operator[]((vec<3,_float,_(glm::qualifier)0> *)this,2);
  std::abs((int)this);
  if (extraout_XMM0_Da <= 0.01) {
    glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>
              ((vec<3,float,(glm::qualifier)0> *)&A_local.field_1,-1,1,1);
  }
  else {
    glm::vec<3,_float,_(glm::qualifier)0>::vec
              ((vec<3,_float,_(glm::qualifier)0> *)&A_local.field_1,
               1.0 - (local_b8.x + aStack_b4.y) / u.field_0.x,aStack_b4.y / u.field_0.x,
               local_b8.x / u.field_0.x);
  }
  VVar3.field_2 = local_c;
  VVar3.field_0.x = A_local.field_1.y;
  VVar3.field_1.y = A_local.field_2.z;
  return VVar3;
}

Assistant:

Vec3f barycentric(glm::vec<DimRows, float, glm::defaultp> A,
                  glm::vec<DimRows, float, glm::defaultp> B,
                  glm::vec<DimRows, float, glm::defaultp> C,
                  glm::vec<DimRows, float, glm::defaultp> P) {
  if (DimRows < 2) {
    return Vec3f(1., 1., 1.);
  } else {
    Vec3f s[2];
    for (int i = 0; i < 2; i++) {
      s[i][0] = C[i] - A[i];
      s[i][1] = B[i] - A[i];
      s[i][2] = A[i] - P[i];
    }
    Vec3f u = cross(s[0], s[1]);
    if (std::abs(u[2]) > 1e-2)  // dont forget that u[2] is integer. If it is
                                // zero then triangle ABC is degenerate
      return Vec3f(1.f - (u.x + u.y) / u.z, u.y / u.z, u.x / u.z);
    return Vec3f(-1, 1, 1);  // in this case generate negative coordinates, it
                             // will be thrown away by the rasterizator
  }
}